

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint data,Static_Data_Model *M)

{
  uchar *puVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = this->base;
  uVar5 = this->length >> 0xf;
  uVar4 = M->distribution[data];
  if (M->last_symbol == data) {
    uVar6 = uVar5 * uVar4 + uVar2;
    this->base = uVar6;
    uVar5 = this->length - uVar5 * uVar4;
  }
  else {
    this->length = uVar5;
    uVar6 = uVar5 * uVar4 + uVar2;
    this->base = uVar6;
    uVar5 = (M->distribution[data + 1] - uVar4) * uVar5;
  }
  this->length = uVar5;
  if (uVar6 < uVar2) {
    puVar3 = this->ac_pointer;
    while( true ) {
      puVar1 = puVar3 + -1;
      puVar3 = puVar3 + -1;
      if (*puVar1 != 0xff) break;
      *puVar3 = '\0';
    }
    *puVar3 = *puVar1 + '\x01';
    uVar5 = this->length;
  }
  if (uVar5 < 0x1000000) {
    uVar2 = this->base;
    do {
      puVar3 = this->ac_pointer;
      this->ac_pointer = puVar3 + 1;
      *puVar3 = (uchar)(uVar2 >> 0x18);
      uVar2 = this->base << 8;
      this->base = uVar2;
      uVar4 = this->length << 8;
      this->length = uVar4;
    } while (uVar4 < 0x1000000);
  }
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned data,
                                  Static_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
      if (data >= M.data_symbols) AC_Error("invalid data symbol");
    #endif

      unsigned x, init_base = base;
                                                               // compute products
      if (data == M.last_symbol) {
        x = M.distribution[data] * (length >> DM__LengthShift);
        base   += x;                                            // update interval
        length -= x;                                          // no product needed
      }
      else {
        x = M.distribution[data] * (length >>= DM__LengthShift);
        base   += x;                                            // update interval
        length  = M.distribution[data+1] * length - x;
      }
             
      if (init_base > base) propagate_carry();                 // overflow = carry

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization
    }